

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  char cVar1;
  int iVar2;
  FIELD *field;
  long *plVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char fmt_s [3];
  char firstLine [512];
  char thirdLine [512];
  char secondLine [512];
  char fmt [512];
  undefined2 local_82c;
  undefined1 local_82a;
  char local_828 [512];
  char local_628 [512];
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined3 uStack_218;
  undefined4 uStack_215;
  undefined4 uStack_211;
  
  iVar2 = -1;
  iVar6 = -1;
  if (_stdscr != 0) {
    iVar6 = *(short *)(_stdscr + 4) + 1;
    iVar2 = *(short *)(_stdscr + 6) + 1;
  }
  if (((0x40 < iVar2) && (this->InitialWidth <= iVar2)) && (5 < iVar6)) {
    form = (this->super_cmCursesForm).Form;
    if (form == (FORM *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      field = current_field(form);
      plVar3 = (long *)field_userptr(field);
    }
    local_82a = 0;
    local_82c = 0x7325;
    if ((plVar3 == (long *)0x0) || (cVar1 = (**(code **)(*plVar3 + 0x30))(plVar3), cVar1 == '\0')) {
      memset(local_828,0,0x200);
      memset(&local_428,0,0x200);
      memset(local_628,0,0x200);
      if (process == 0) {
        if (this->OkToGenerate == true) {
          builtin_strncpy(local_828 + 0x30,"te and exit",0xc);
          builtin_strncpy(local_828 + 0x20,"ss [g] to genera",0x10);
          builtin_strncpy(local_828 + 0x18,"     Pre",8);
        }
        else {
          builtin_strncpy(local_828 + 0x30,"           ",0xc);
          builtin_strncpy(local_828 + 0x20,"                ",0x10);
          builtin_strncpy(local_828 + 0x18,"        ",8);
        }
        builtin_strncpy(local_828,"Press [c] to configure  ",0x18);
        pcVar5 = "Off";
        if (this->AdvancedMode != false) {
          pcVar5 = "On";
        }
        sprintf(local_628,"Press [t] to toggle advanced mode (Currently %s)",pcVar5);
        memcpy(&local_428,"Press [h] for help           Press [q] to quit without generating",0x42);
      }
      else {
        builtin_strncpy(local_828 + 0x40,"    ",4);
        builtin_strncpy(local_828 + 0x30,"                ",0x10);
        builtin_strncpy(local_828 + 0x20,"                ",0x10);
        builtin_strncpy(local_828 + 0x10,"                ",0x10);
        builtin_strncpy(local_828,"                ",0x10);
        local_428 = 0x20202020;
        uStack_424 = 0x20202020;
        uStack_420 = 0x20202020;
        uStack_41c = 0x20202020;
        local_418 = 0x20202020;
        uStack_414 = 0x20202020;
        uStack_410 = 0x20202020;
        uStack_40c = 0x20202020;
        local_408 = 0x20202020;
        uStack_404 = 0x20202020;
        uStack_400 = 0x20202020;
        uStack_3fc = 0x20202020;
        local_3f8 = 0x20202020;
        uStack_3f4 = 0x20202020;
        uStack_3f0 = 0x20202020;
        uStack_3ec = 0x20202020;
        local_3e8 = 0x20202020;
        builtin_strncpy(local_628,
                        "                                                                    ",0x44)
        ;
      }
      move(iVar6 + -4,0);
      memcpy(&local_228,"Press [enter] to edit option Press [d] to delete an entry",0x200);
      if (process != 0) {
        uStack_218 = 0x202020;
        uStack_215 = 0x20202020;
        uStack_211 = 0x20202020;
        local_228 = 0x20202020;
        uStack_224 = 0x20202020;
        uStack_220 = 0x20202020;
        uStack_21c = 0x20202020;
      }
      printw(&local_82c,&local_228);
      move(iVar6 + -3,0);
      printw(&local_82c,local_828);
      move(iVar6 + -2,0);
      printw(&local_82c,&local_428);
      move(iVar6 + -1,0);
      printw(&local_82c);
    }
    if (plVar3 != (long *)0x0) {
      memset(local_828,0,0x200);
      sprintf(local_828,"Page %d of %d",(ulong)*(uint *)(plVar3 + 7),
              (ulong)(uint)this->NumberOfPages);
      sVar4 = strlen(local_828);
      move(0,0x40 - (int)sVar4);
      printw(&local_82c,local_828);
    }
    pos_form_cursor((this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = nullptr;
  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
  }

  char fmt_s[] = "%s";
  if (cw == nullptr || !cw->PrintKeys()) {
    char firstLine[512] = "";
    char secondLine[512] = "";
    char thirdLine[512] = "";
    if (process) {
      memset(firstLine, ' ', 68);
      memset(secondLine, ' ', 68);
      memset(thirdLine, ' ', 68);
    } else {
      if (this->OkToGenerate) {
        sprintf(firstLine,
                "Press [c] to configure       Press [g] to generate and exit");
      } else {
        sprintf(firstLine,
                "Press [c] to configure                                     ");
      }
      {
        const char* toggleKeyInstruction =
          "Press [t] to toggle advanced mode (Currently %s)";
        sprintf(thirdLine, toggleKeyInstruction,
                this->AdvancedMode ? "On" : "Off");
      }
      sprintf(secondLine,
              "Press [h] for help           "
              "Press [q] to quit without generating");
    }

    curses_move(y - 4, 0);
    char fmt[512] =
      "Press [enter] to edit option Press [d] to delete an entry";
    if (process) {
      memset(fmt, ' ', 27);
    }
    printw(fmt_s, fmt);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, secondLine);
    curses_move(y - 1, 0);
    printw(fmt_s, thirdLine);
  }

  if (cw) {
    char pageLine[512] = "";
    sprintf(pageLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0, 65 - static_cast<unsigned int>(strlen(pageLine)) - 1);
    printw(fmt_s, pageLine);
  }

  pos_form_cursor(this->Form);
}